

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tetgen.cxx
# Opt level: O1

double __thiscall
tetgenmesh::insphere_s(tetgenmesh *this,double *pa,double *pb,double *pc,double *pd,double *pe)

{
  int iVar1;
  double *pdVar2;
  double *pc_00;
  double *pd_00;
  undefined4 *puVar3;
  int iVar4;
  uint uVar5;
  uint uVar6;
  int iVar7;
  ulong uVar8;
  double dVar9;
  point pt [5];
  double *local_58 [5];
  
  dVar9 = insphere(pa,pb,pc,pd,pe);
  if ((dVar9 == 0.0) && (!NAN(dVar9))) {
    local_58[0] = pa;
    local_58[1] = pb;
    local_58[2] = pc;
    local_58[3] = pd;
    local_58[4] = pe;
    iVar1 = this->pointmarkindex;
    iVar4 = 5;
    uVar6 = 0;
    uVar5 = 4;
    do {
      iVar7 = 0;
      if (1 < iVar4) {
        uVar8 = 0;
        iVar7 = 0;
        do {
          pdVar2 = local_58[uVar8];
          if (*(int *)((long)local_58[uVar8 + 1] + (long)iVar1 * 4) <
              *(int *)((long)pdVar2 + (long)iVar1 * 4)) {
            local_58[uVar8] = local_58[uVar8 + 1];
            local_58[uVar8 + 1] = pdVar2;
            iVar7 = iVar7 + 1;
          }
          uVar8 = uVar8 + 1;
        } while (uVar5 != uVar8);
      }
      pd_00 = local_58[4];
      pc_00 = local_58[3];
      pdVar2 = local_58[2];
      iVar4 = iVar4 + -1;
      uVar6 = uVar6 + iVar7;
      uVar5 = uVar5 - 1;
    } while (0 < iVar7);
    dVar9 = orient3d(local_58[1],local_58[2],local_58[3],local_58[4]);
    if ((dVar9 != 0.0) || (NAN(dVar9))) {
      if ((uVar6 & 1) == 0) {
        return dVar9;
      }
    }
    else {
      dVar9 = orient3d(local_58[0],pdVar2,pc_00,pd_00);
      if ((dVar9 == 0.0) && (!NAN(dVar9))) {
        puVar3 = (undefined4 *)__cxa_allocate_exception(4);
        *puVar3 = 2;
        __cxa_throw(puVar3,&int::typeinfo,0);
      }
      if ((uVar6 & 1) != 0) {
        return dVar9;
      }
    }
    dVar9 = -dVar9;
  }
  return dVar9;
}

Assistant:

REAL tetgenmesh::insphere_s(REAL* pa, REAL* pb, REAL* pc, REAL* pd, REAL* pe)
{
  REAL sign;

  sign = insphere(pa, pb, pc, pd, pe);
  if (sign != 0.0) {
    return sign;
  }

  // Symbolic perturbation.
  point pt[5], swappt;
  REAL oriA, oriB;
  int swaps, count;
  int n, i;

  pt[0] = pa;
  pt[1] = pb;
  pt[2] = pc;
  pt[3] = pd;
  pt[4] = pe;
  
  // Sort the five points such that their indices are in the increasing
  //   order. An optimized bubble sort algorithm is used, i.e., it has
  //   the worst case O(n^2) runtime, but it is usually much faster.
  swaps = 0; // Record the total number of swaps.
  n = 5;
  do {
    count = 0;
    n = n - 1;
    for (i = 0; i < n; i++) {
      if (pointmark(pt[i]) > pointmark(pt[i+1])) {
        swappt = pt[i]; pt[i] = pt[i+1]; pt[i+1] = swappt;
        count++;
      }
    }
    swaps += count;
  } while (count > 0); // Continue if some points are swapped.

  oriA = orient3d(pt[1], pt[2], pt[3], pt[4]);
  if (oriA != 0.0) {
    // Flip the sign if there are odd number of swaps.
    if ((swaps % 2) != 0) oriA = -oriA;
    return oriA;
  }
  
  oriB = -orient3d(pt[0], pt[2], pt[3], pt[4]);
  if (oriB == 0.0) {
    terminatetetgen(this, 2);
  }
  // Flip the sign if there are odd number of swaps.
  if ((swaps % 2) != 0) oriB = -oriB;
  return oriB;
}